

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O1

error_info *
toml::detail::make_not_found_error<toml::type_config>
          (error_info *__return_storage_ptr__,basic_value<toml::type_config> *v,string *fname,
          key_type *key)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  undefined8 uVar8;
  long *plVar9;
  region_type *r;
  long *plVar10;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  locs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string title;
  source_location loc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_238;
  size_type local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  size_type *local_1f8;
  size_type local_1f0;
  size_type local_1e8;
  undefined8 uStack_1e0;
  long *local_1d8;
  size_type local_1d0;
  undefined1 local_1c8;
  undefined7 uStack_1c7;
  undefined8 uStack_1c0;
  long *local_1b8;
  size_type local_1b0;
  undefined1 local_1a8;
  undefined7 uStack_1a7;
  undefined8 uStack_1a0;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_198;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_178;
  char *local_160;
  size_type local_158;
  char local_150;
  undefined7 uStack_14f;
  undefined8 uStack_148;
  char *local_140;
  size_type local_138;
  char local_130;
  undefined7 uStack_12f;
  undefined8 uStack_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_120;
  size_type local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110 [6];
  source_location local_a8;
  
  r = &v->region_;
  source_location::source_location(&local_a8,r);
  paVar2 = &local_258.field_2;
  pcVar4 = (fname->_M_dataplus)._M_p;
  local_258._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,pcVar4,pcVar4 + fname->_M_string_length);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_258,": key \"");
  pcVar4 = (key->_M_dataplus)._M_p;
  local_238 = &local_228;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,pcVar4,pcVar4 + key->_M_string_length);
  local_218._M_string_length = local_230;
  if (local_238 == &local_228) {
    local_110[0]._8_8_ = local_228._8_8_;
    local_120 = local_110;
  }
  else {
    local_120 = local_238;
  }
  local_110[0]._M_allocated_capacity._1_7_ = local_228._M_allocated_capacity._1_7_;
  local_110[0]._M_local_buf[0] = local_228._M_local_buf[0];
  local_118 = local_230;
  local_230 = 0;
  local_228._M_local_buf[0] = '\0';
  paVar3 = &local_218.field_2;
  if (local_120 == local_110) {
    local_218.field_2._8_8_ = local_110[0]._8_8_;
    local_218._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_218._M_dataplus._M_p = (pointer)local_120;
  }
  local_218.field_2._M_allocated_capacity = local_110[0]._M_allocated_capacity;
  uVar8 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar2) {
    uVar8 = local_258.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar8 < local_258._M_string_length + local_218._M_string_length) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar3) {
      uVar8 = local_110[0]._M_allocated_capacity;
    }
    if (local_258._M_string_length + local_218._M_string_length <= (ulong)uVar8) {
      local_238 = &local_228;
      pbVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::replace(&local_218,0,0,local_258._M_dataplus._M_p,local_258._M_string_length);
      goto LAB_001f65ba;
    }
  }
  local_238 = &local_228;
  pbVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_258,local_218._M_dataplus._M_p,local_218._M_string_length);
LAB_001f65ba:
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar6->_M_dataplus)._M_p;
  paVar7 = &pbVar6->field_2;
  if (paVar5 == paVar7) {
    local_278.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_278.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
  }
  else {
    local_278.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_278._M_dataplus._M_p = (pointer)paVar5;
  }
  local_278._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar6->_M_string_length = 0;
  paVar7->_M_local_buf[0] = '\0';
  pbVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           append(&local_278,"\" not found");
  local_1f8 = (size_type *)(pbVar6->_M_dataplus)._M_p;
  paVar7 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8 == paVar7) {
    local_1e8 = paVar7->_M_allocated_capacity;
    uStack_1e0 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    local_1f8 = &local_1e8;
  }
  else {
    local_1e8 = paVar7->_M_allocated_capacity;
  }
  local_1f0 = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != paVar3) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if (local_238 != &local_228) {
    operator_delete(local_238,
                    CONCAT71(local_228._M_allocated_capacity._1_7_,local_228._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  local_278._M_dataplus._M_p = (pointer)0x0;
  local_278._M_string_length = 0;
  local_278.field_2._M_allocated_capacity = 0;
  if (local_a8.is_ok_ == false) {
    plVar10 = (long *)&local_1a8;
    local_1b8 = plVar10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,local_1f8,(pointer)(local_1f0 + (long)local_1f8));
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_178,
             (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_278);
    local_140 = &local_130;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"");
    paVar1 = &(__return_storage_ptr__->title_).field_2;
    (__return_storage_ptr__->title_)._M_dataplus._M_p = (pointer)paVar1;
    if (local_1b8 == plVar10) {
      paVar1->_M_allocated_capacity = CONCAT71(uStack_1a7,local_1a8);
      *(undefined8 *)((long)&(__return_storage_ptr__->title_).field_2 + 8) = uStack_1a0;
    }
    else {
      (__return_storage_ptr__->title_)._M_dataplus._M_p = (pointer)local_1b8;
      (__return_storage_ptr__->title_).field_2._M_allocated_capacity =
           CONCAT71(uStack_1a7,local_1a8);
    }
    (__return_storage_ptr__->title_)._M_string_length = local_1b0;
    local_1b0 = 0;
    local_1a8 = 0;
    (__return_storage_ptr__->locations_).
    super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_178.
         super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->locations_).
    super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_178.
         super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->locations_).
    super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_178.
         super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_178.
    super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_178.
    super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_178.
    super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    paVar1 = &(__return_storage_ptr__->suffix_).field_2;
    (__return_storage_ptr__->suffix_)._M_dataplus._M_p = (pointer)paVar1;
    if (local_140 == &local_130) {
      paVar1->_M_allocated_capacity = CONCAT71(uStack_12f,local_130);
      *(undefined8 *)((long)&(__return_storage_ptr__->suffix_).field_2 + 8) = uStack_128;
    }
    else {
      (__return_storage_ptr__->suffix_)._M_dataplus._M_p = local_140;
      (__return_storage_ptr__->suffix_).field_2._M_allocated_capacity =
           CONCAT71(uStack_12f,local_130);
    }
    (__return_storage_ptr__->suffix_)._M_string_length = local_138;
    local_138 = 0;
    local_130 = '\0';
    local_1b8 = plVar10;
    local_140 = &local_130;
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_178);
    plVar9 = local_1b8;
  }
  else {
    if (((local_a8.first_line_ == 1) && (local_a8.first_column_ == 1)) && (local_a8.length_ == 1)) {
      source_location::source_location((source_location *)&local_120,r);
      std::
      vector<std::pair<toml::source_location,std::__cxx11::string>,std::allocator<std::pair<toml::source_location,std::__cxx11::string>>>
      ::emplace_back<toml::source_location,char_const(&)[23]>
                ((vector<std::pair<toml::source_location,std::__cxx11::string>,std::allocator<std::pair<toml::source_location,std::__cxx11::string>>>
                  *)&local_278,(source_location *)&local_120,(char (*) [23])"at the top-level table"
                );
    }
    else {
      source_location::source_location((source_location *)&local_120,r);
      std::
      vector<std::pair<toml::source_location,std::__cxx11::string>,std::allocator<std::pair<toml::source_location,std::__cxx11::string>>>
      ::emplace_back<toml::source_location,char_const(&)[14]>
                ((vector<std::pair<toml::source_location,std::__cxx11::string>,std::allocator<std::pair<toml::source_location,std::__cxx11::string>>>
                  *)&local_278,(source_location *)&local_120,(char (*) [14])"in this table");
    }
    source_location::~source_location((source_location *)&local_120);
    plVar10 = (long *)&local_1c8;
    local_1d8 = plVar10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d8,local_1f8,(pointer)(local_1f0 + (long)local_1f8));
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_198,
             (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_278);
    local_160 = &local_150;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"");
    paVar1 = &(__return_storage_ptr__->title_).field_2;
    (__return_storage_ptr__->title_)._M_dataplus._M_p = (pointer)paVar1;
    if (local_1d8 == plVar10) {
      paVar1->_M_allocated_capacity = CONCAT71(uStack_1c7,local_1c8);
      *(undefined8 *)((long)&(__return_storage_ptr__->title_).field_2 + 8) = uStack_1c0;
    }
    else {
      (__return_storage_ptr__->title_)._M_dataplus._M_p = (pointer)local_1d8;
      (__return_storage_ptr__->title_).field_2._M_allocated_capacity =
           CONCAT71(uStack_1c7,local_1c8);
    }
    (__return_storage_ptr__->title_)._M_string_length = local_1d0;
    local_1d0 = 0;
    local_1c8 = 0;
    (__return_storage_ptr__->locations_).
    super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_198.
         super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->locations_).
    super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_198.
         super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->locations_).
    super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_198.
         super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_198.
    super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_198.
    super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_198.
    super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    paVar1 = &(__return_storage_ptr__->suffix_).field_2;
    (__return_storage_ptr__->suffix_)._M_dataplus._M_p = (pointer)paVar1;
    if (local_160 == &local_150) {
      paVar1->_M_allocated_capacity = CONCAT71(uStack_14f,local_150);
      *(undefined8 *)((long)&(__return_storage_ptr__->suffix_).field_2 + 8) = uStack_148;
    }
    else {
      (__return_storage_ptr__->suffix_)._M_dataplus._M_p = local_160;
      (__return_storage_ptr__->suffix_).field_2._M_allocated_capacity =
           CONCAT71(uStack_14f,local_150);
    }
    (__return_storage_ptr__->suffix_)._M_string_length = local_158;
    local_158 = 0;
    local_150 = '\0';
    local_1d8 = plVar10;
    local_160 = &local_150;
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_198);
    plVar9 = local_1d8;
  }
  if (plVar9 != plVar10) {
    operator_delete(plVar9,*plVar10 + 1);
  }
  std::
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_278);
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8,local_1e8 + 1);
  }
  source_location::~source_location(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

error_info make_not_found_error(const basic_value<TC>& v, const std::string& fname, const typename basic_value<TC>::key_type& key)
{
    const auto loc = v.location();
    const std::string title = fname + ": key \"" + string_conv<std::string>(key) + "\" not found";

    std::vector<std::pair<source_location, std::string>> locs;
    if( ! loc.is_ok())
    {
        return error_info(title, locs);
    }

    if(loc.first_line_number() == 1 && loc.first_column_number() == 1 && loc.length() == 1)
    {
        // The top-level table has its region at the 0th character of the file.
        // That means that, in the case when a key is not found in the top-level
        // table, the error message points to the first character. If the file has
        // the first table at the first line, the error message would be like this.
        // ```console
        // [error] key "a" not found
        //  --> example.toml
        //    |
        //  1 | [table]
        //    | ^------ in this table
        // ```
        // It actually points to the top-level table at the first character, not
        // `[table]`. But it is too confusing. To avoid the confusion, the error
        // message should explicitly say "key not found in the top-level table".
        locs.emplace_back(v.location(), "at the top-level table");
    }
    else
    {
        locs.emplace_back(v.location(), "in this table");
    }
    return error_info(title, locs);
}